

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void clunk::InitKnightMoves(int from)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint64_t map;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1ee,"void clunk::InitKnightMoves(const int)");
  }
  lVar2 = 0;
  map = 0;
  iVar3 = 0;
  do {
    uVar4 = *(int *)((long)&DAT_0014e7e0 + lVar2) + from;
    if ((uVar4 & 0xffffff88) == 0) {
      if (0x38 < iVar3) {
        __assert_fail("shift <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1f8,"void clunk::InitKnightMoves(const int)");
      }
      map = map | (ulong)uVar4 + 1 << ((byte)iVar3 & 0x3f);
      iVar3 = iVar3 + 8;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x20);
  bVar1 = VerifyMoveMap(from,map);
  if (bVar1) {
    *(uint64_t *)(_knightMoves + (ulong)(uint)from * 8) = map;
    return;
  }
  __assert_fail("VerifyMoveMap(from, mvs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x1fd,"void clunk::InitKnightMoves(const int)");
}

Assistant:

void InitKnightMoves(const int from) {
  assert(IS_SQUARE(from));
  const int DIRECTION[8] = {
    KnightMove1, KnightMove2, KnightMove3, KnightMove4,
    KnightMove5, KnightMove6, KnightMove7, KnightMove8
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 8; ++i) {
    const int to = (from + DIRECTION[i]);
    if (IS_SQUARE(to)) {
      assert(shift <= 56);
      mvs |= (uint64_t(to + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _knightMoves[from] = mvs;
}